

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest> * __thiscall
testing::internal::ParameterizedTestSuiteRegistry::
GetTestSuitePatternHolder<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>
          (ParameterizedTestSuiteRegistry *this,char *test_suite_name,CodeLocation *code_location)

{
  bool bVar1;
  int iVar2;
  reference ppPVar3;
  undefined4 extraout_var;
  TypeId pvVar4;
  ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest> *__x;
  CodeLocation *in_RDX;
  CodeLocation *in_RSI;
  ParameterizedTestSuiteInfoBase **test_suite_info;
  iterator __end3;
  iterator __begin3;
  TestSuiteInfoContainer *__range3;
  ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest> *typed_test_info
  ;
  CodeLocation *in_stack_ffffffffffffff18;
  CodeLocation *in_stack_ffffffffffffff20;
  CodeLocation *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar5;
  ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>
  *in_stack_ffffffffffffff60;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfoBase_**,_std::vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>_>
  local_30 [2];
  ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest> *local_20;
  
  local_20 = (ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest> *)
             0x0;
  local_30[0]._M_current =
       (ParameterizedTestSuiteInfoBase **)
       std::
       vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
       ::begin((vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                *)in_stack_ffffffffffffff18);
  std::
  vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
  ::end((vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
         *)in_stack_ffffffffffffff18);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<testing::internal::ParameterizedTestSuiteInfoBase_**,_std::vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<testing::internal::ParameterizedTestSuiteInfoBase_**,_std::vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!bVar1) {
LAB_0045a3b9:
      if (local_20 ==
          (ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest> *)0x0)
      {
        __x = (ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest> *)
              operator_new(0x80);
        uVar5 = 1;
        CodeLocation::CodeLocation(in_RSI,(CodeLocation *)__x);
        ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>::
        ParameterizedTestSuiteInfo
                  (in_stack_ffffffffffffff60,(char *)CONCAT17(uVar5,in_stack_ffffffffffffff58),
                   in_stack_ffffffffffffff50);
        local_20 = __x;
        CodeLocation::~CodeLocation((CodeLocation *)0x45a429);
        std::
        vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
        ::push_back((vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                     *)in_RSI,(value_type *)__x);
      }
      return local_20;
    }
    ppPVar3 = __gnu_cxx::
              __normal_iterator<testing::internal::ParameterizedTestSuiteInfoBase_**,_std::vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>_>
              ::operator*(local_30);
    (*(*ppPVar3)->_vptr_ParameterizedTestSuiteInfoBase[2])();
    bVar1 = std::operator==(&in_stack_ffffffffffffff20->file,(char *)in_stack_ffffffffffffff18);
    if (bVar1) {
      iVar2 = (*(*ppPVar3)->_vptr_ParameterizedTestSuiteInfoBase[3])();
      pvVar4 = GetTypeId<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>();
      if ((TypeId)CONCAT44(extraout_var,iVar2) != pvVar4) {
        CodeLocation::CodeLocation(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        ReportInvalidTestSuiteType((char *)in_RSI,in_RDX);
        CodeLocation::~CodeLocation((CodeLocation *)0x45a366);
        posix::Abort();
      }
      local_20 = CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>,testing::internal::ParameterizedTestSuiteInfoBase>
                           ((ParameterizedTestSuiteInfoBase *)in_stack_ffffffffffffff50);
      goto LAB_0045a3b9;
    }
    __gnu_cxx::
    __normal_iterator<testing::internal::ParameterizedTestSuiteInfoBase_**,_std::vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>_>
    ::operator++(local_30);
  } while( true );
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      const char* test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;
    for (auto& test_suite_info : test_suite_infos_) {
      if (test_suite_info->GetTestSuiteName() == test_suite_name) {
        if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
          // Complain about incorrect usage of Google Test facilities
          // and terminate the program since we cannot guaranty correct
          // test suite setup and tear-down in this case.
          ReportInvalidTestSuiteType(test_suite_name, code_location);
          posix::Abort();
        } else {
          // At this point we are sure that the object we found is of the same
          // type we are looking for, so we downcast it to that type
          // without further checks.
          typed_test_info = CheckedDowncastToActualType<
              ParameterizedTestSuiteInfo<TestSuite>>(test_suite_info);
        }
        break;
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, code_location);
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }